

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateHeartbeat(Session *this)

{
  Header *header;
  allocator<char> local_1e1;
  STRING local_1e0;
  MsgType local_1c0;
  undefined1 local_168 [8];
  Message heartbeat;
  Session *this_local;
  
  heartbeat._336_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"0",&local_1e1);
  MsgType::MsgType(&local_1c0,&local_1e0);
  newMessage((Message *)local_168,this,&local_1c0);
  MsgType::~MsgType(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  header = Message::getHeader((Message *)local_168);
  fill(this,header);
  sendRaw(this,(Message *)local_168,0);
  Message::~Message((Message *)local_168);
  return;
}

Assistant:

void Session::generateHeartbeat() {
  Message heartbeat = newMessage(MsgType(MsgType_Heartbeat));

  fill(heartbeat.getHeader());
  sendRaw(heartbeat);
}